

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParser.h
# Opt level: O0

uint uWS::HttpParser::getHeaders(char *postPaddedBuffer,char *end,Header *headers,BloomFilter *bf)

{
  byte *__str;
  size_t *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  bool bVar1;
  uint i;
  char *start;
  char *preliminaryValue;
  char *preliminaryKey;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  uint local_44;
  byte *local_40;
  byte *local_38;
  byte *local_30;
  size_t *local_20;
  byte *local_18;
  byte *local_10;
  
  local_44 = 0;
  local_40 = in_RDI;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    __str = local_10;
    if (0x31 < local_44) {
      return 0;
    }
    local_30 = local_10;
    while (*local_10 != 0x3a && ' ' < (char)*local_10) {
      *local_10 = *local_10 | 0x20;
      local_10 = local_10 + 1;
    }
    if (*local_10 == 0xd) break;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,(char *)__str,(long)local_10 - (long)__str);
    *local_20 = local_68._M_len;
    local_20[1] = (size_t)local_68._M_str;
    do {
      local_10 = local_10 + 1;
      if ((*local_10 == 0x3a) || (bVar1 = false, (char)*local_10 < '!')) {
        bVar1 = *local_10 != 0xd;
      }
    } while (bVar1);
    local_38 = local_10;
    local_10 = (byte *)memchr(local_10,0xd,(long)local_18 - (long)local_10);
    if ((local_10 == (byte *)0x0) || (*(char *)((long)local_10 + 1) != '\n')) {
      return 0;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,(char *)local_38,(long)local_10 - (long)local_38);
    local_20[2] = local_78._M_len;
    local_20[3] = (size_t)local_78._M_str;
    local_10 = (byte *)((long)local_10 + 2);
    local_20 = local_20 + 4;
    local_44 = local_44 + 1;
  }
  if ((local_10 != local_18 && local_10[1] == 10) && local_44 != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,(char *)0x0,0);
    *local_20 = local_58._M_len;
    local_20[1] = (size_t)local_58._M_str;
    return ((int)local_10 + 2) - (int)local_40;
  }
  return 0;
}

Assistant:

static unsigned int getHeaders(char *postPaddedBuffer, char *end, struct HttpRequest::Header *headers, BloomFilter *bf) {
        char *preliminaryKey, *preliminaryValue, *start = postPaddedBuffer;

        for (unsigned int i = 0; i < HttpRequest::MAX_HEADERS; i++) {
            for (preliminaryKey = postPaddedBuffer; (*postPaddedBuffer != ':') & (*postPaddedBuffer > 32); *(postPaddedBuffer++) |= 32);
            if (*postPaddedBuffer == '\r') {
                if ((postPaddedBuffer != end) & (postPaddedBuffer[1] == '\n') & (i > 0)) {
                    headers->key = std::string_view(nullptr, 0);
                    return (unsigned int) ((postPaddedBuffer + 2) - start);
                } else {
                    return 0;
                }
            } else {
                headers->key = std::string_view(preliminaryKey, (size_t) (postPaddedBuffer - preliminaryKey));
                for (postPaddedBuffer++; (*postPaddedBuffer == ':' || *postPaddedBuffer < 33) && *postPaddedBuffer != '\r'; postPaddedBuffer++);
                preliminaryValue = postPaddedBuffer;
                postPaddedBuffer = (char *) memchr(postPaddedBuffer, '\r', end - postPaddedBuffer);
                if (postPaddedBuffer && postPaddedBuffer[1] == '\n') {
                    headers->value = std::string_view(preliminaryValue, (size_t) (postPaddedBuffer - preliminaryValue));
                    postPaddedBuffer += 2;
                    headers++;
                } else {
                    return 0;
                }
            }
        }
        return 0;
    }